

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_envs.cxx
# Opt level: O2

void __thiscall level_tools::reconstruct_sound_envs(level_tools *this)

{
  cf_vertex_vec *verts;
  xr_level_snd_env *pxVar1;
  pointer pptVar2;
  ulong uVar3;
  void *pvVar4;
  temp_box *ptVar5;
  long lVar6;
  uint_fast32_t uVar7;
  xr_scene_sound_envs *pxVar8;
  xr_sound_env_object *this_00;
  cf_face *face;
  ulong uVar9;
  uint_fast32_t uVar10;
  pointer pptVar11;
  xr_custom_object_vec *this_01;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  xr_name_gen name;
  vector<temp_box_*,_std::allocator<temp_box_*>_> boxes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> adjacents;
  xr_sound_env_object *local_38;
  
  pxVar1 = this->m_level->m_snd_env;
  if (pxVar1 != (xr_level_snd_env *)0x0) {
    xray_re::msg("building %s","sound_env.part");
    boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<temp_box_*,_std::allocator<temp_box_*>_>::reserve
              (&boxes,(ulong)(((long)(pxVar1->super_xr_cform).m_faces.
                                     super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pxVar1->super_xr_cform).m_faces.
                                    super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x1c) / 0xc);
    adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&adjacents,0xc);
    uVar3 = ((long)(pxVar1->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pxVar1->super_xr_cform).m_faces.
                  super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x1c;
    pvVar4 = operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    std::__fill_n_a<unsigned_int*,unsigned_long,unsigned_int>(pvVar4,uVar3,&BAD_IDX);
    verts = &(pxVar1->super_xr_cform).m_vertices;
    uVar3 = ((long)(pxVar1->super_xr_cform).m_faces.
                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(pxVar1->super_xr_cform).m_faces.
                  super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x1c;
    while (uVar3 != 0) {
      uVar9 = uVar3 - 1;
      lVar6 = uVar3 * 4;
      uVar3 = uVar9;
      if (*(int *)((long)pvVar4 + lVar6 + -4) == -1) {
        uVar10 = uVar9 & 0xffffffff;
        bVar12 = true;
        while( true ) {
          face = (pxVar1->super_xr_cform).m_faces.
                 super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
          if (bVar12) {
            ptVar5 = (temp_box *)operator_new(0x4c);
            temp_box::temp_box(ptVar5,face,verts);
            name.m_name = (char *)ptVar5;
            std::vector<temp_box*,std::allocator<temp_box*>>::emplace_back<temp_box*>
                      ((vector<temp_box*,std::allocator<temp_box*>> *)&boxes,(temp_box **)&name);
          }
          else {
            temp_box::collect(boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1],face,verts);
          }
          *(undefined4 *)((long)pvVar4 + uVar10 * 4) = 0;
          lVar6 = 3;
          while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
            uVar9 = (ulong)*(uint *)((long)face + lVar6 * 4);
            for (uVar7 = (uint_fast32_t)
                         (verts->
                         super__Vector_base<xray_re::cf_vertex,_std::allocator<xray_re::cf_vertex>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar9].face0;
                uVar7 != 0xffffffff;
                uVar7 = xray_re::cf_face::next_face_idx
                                  ((pxVar1->super_xr_cform).m_faces.
                                   super__Vector_base<xray_re::cf_face,_std::allocator<xray_re::cf_face>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar7,uVar9)) {
              if ((uVar7 != uVar10) && (*(int *)((long)pvVar4 + uVar7 * 4) == -1)) {
                name.m_name = (char *)CONCAT44(name.m_name._4_4_,(int)uVar7);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                          (&adjacents,(uint *)&name);
                *(undefined4 *)((long)pvVar4 + uVar7 * 4) = 0xffffffff;
              }
            }
          }
          if (adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          uVar10 = (uint_fast32_t)
                   adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1];
          adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          bVar12 = false;
        }
      }
    }
    operator_delete__(pvVar4);
    pxVar8 = xray_re::xr_scene::sound_envs(this->m_scene);
    this_01 = &(pxVar8->super_xr_scene_objects).m_objects;
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_01,(long)boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
    xray_re::xr_name_gen::init(&name,(EVP_PKEY_CTX *)"sound_env");
    pptVar2 = boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (pptVar11 = boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>._M_impl.
                    super__Vector_impl_data._M_start; pptVar11 != pptVar2; pptVar11 = pptVar11 + 1)
    {
      ptVar5 = *pptVar11;
      this_00 = (xr_sound_env_object *)operator_new(200);
      xray_re::xr_sound_env_object::xr_sound_env_object(this_00,this->m_scene);
      std::__cxx11::string::assign
                ((char *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_name);
      (this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0.field_0.z =
           (ptVar5->xform).field_0.field_0._43;
      *(undefined8 *)&(this_00->super_xr_shape_object).super_xr_custom_object.m_position.field_0 =
           *(undefined8 *)((long)&(ptVar5->xform).field_0 + 0x30);
      fVar13 = xray_re::_vector3<float>::normalize_magn((_vector3<float> *)&ptVar5->xform);
      fVar14 = xray_re::_vector3<float>::normalize_magn(&(ptVar5->xform).field_0.field_1.j);
      fVar15 = xray_re::_vector3<float>::normalize_magn(&(ptVar5->xform).field_0.field_1.k);
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.x = fVar13;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.y = fVar14;
      (this_00->super_xr_shape_object).super_xr_custom_object.m_scale.field_0.field_0.z = fVar15;
      xray_re::_matrix<float>::get_xyz
                (&ptVar5->xform,&(this_00->super_xr_shape_object).super_xr_custom_object.m_rotation)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at(&pxVar1->m_env_ids,(ulong)ptVar5->inner);
      std::__cxx11::string::_M_assign((string *)&this_00->m_inner);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at(&pxVar1->m_env_ids,(ulong)ptVar5->outer);
      std::__cxx11::string::_M_assign((string *)&this_00->m_outer);
      operator_delete(ptVar5,0x4c);
      local_38 = this_00;
      std::vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>>::
      emplace_back<xray_re::xr_custom_object*>
                ((vector<xray_re::xr_custom_object*,std::allocator<xray_re::xr_custom_object*>> *)
                 this_01,(xr_custom_object **)&local_38);
      xray_re::xr_name_gen::next(&name);
    }
    xray_re::xr_level::clear_snd_env(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen(&name);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&adjacents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::_Vector_base<temp_box_*,_std::allocator<temp_box_*>_>::~_Vector_base
              (&boxes.super__Vector_base<temp_box_*,_std::allocator<temp_box_*>_>);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_envs()
{
	const xr_level_snd_env* snd_env = m_level->snd_env();
	if (snd_env == 0)
		return;
	msg("building %s", "sound_env.part");

	const cf_face_vec& faces = snd_env->faces();
	const cf_vertex_vec& verts = snd_env->vertices();

	std::vector<temp_box*> boxes;
	boxes.reserve(faces.size()/12);
	std::vector<uint32_t> adjacents;
	adjacents.reserve(12);

	uint32_t* groups = new uint32_t[faces.size()];
	xr_uninitialized_fill_n(groups, faces.size(), BAD_IDX);
	uint32_t group = 0;
	for (size_t k = faces.size(); k != 0;) {
		if (groups[--k] != BAD_IDX)
			continue;
		bool new_group = true;
		for (uint_fast32_t face_idx = uint_fast32_t(k & UINT32_MAX);;) {
			const cf_face& face = faces[face_idx];
			if (new_group) {
				boxes.push_back(new temp_box(face, verts));
				new_group = false;
			} else {
				boxes.back()->collect(face, verts);
			}
			groups[face_idx] = group;
			for (uint_fast32_t i = 3; i != 0;) {
				uint32_t v = face.v[--i];
				for (uint_fast32_t next = verts[v].face0; next != BAD_IDX;) {
					if (next != face_idx && groups[next] == BAD_IDX) {
						adjacents.push_back(uint32_t(next & UINT32_MAX));
						groups[next] = BAD_IDX;
					}
					next = faces[next].next_face_idx(v);
				}
			}
			if (adjacents.empty())
				break;
			face_idx = uint32_t(adjacents.back());
			adjacents.pop_back();
		}
	}
	delete[] groups;

	xr_custom_object_vec& cobjects = m_scene->sound_envs()->objects();
	cobjects.reserve(boxes.size());

	const std::vector<std::string>& env_ids = snd_env->env_ids();

	xr_name_gen name("sound_env");
	for (std::vector<temp_box*>::iterator it = boxes.begin(), end = boxes.end();
			it != end; ++it, name.next()) {
		temp_box* box = *it;
		xr_sound_env_object* new_sound_env = new xr_sound_env_object(*m_scene);
		new_sound_env->co_name() = name.get();
		new_sound_env->co_position() = box->xform.c;
		new_sound_env->co_scale().set(box->xform.i.normalize_magn(), box->xform.j.normalize_magn(),
			box->xform.k.normalize_magn());
		box->xform.get_xyz(new_sound_env->co_rotation());
		new_sound_env->inner() = env_ids.at(box->inner);
		new_sound_env->outer() = env_ids.at(box->outer);
		delete box;
		cobjects.push_back(new_sound_env);
	}
	m_level->clear_snd_env();
}